

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O1

void __thiscall
cfd::TransactionController::InsertUnlockingScript
          (TransactionController *this,Txid *txid,uint32_t vout,
          vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *unlocking_scripts)

{
  pointer pBVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  ScriptElement *element;
  _func_int **pp_Var5;
  pointer pBVar6;
  ScriptBuilder builder;
  Script script;
  ByteData local_118;
  undefined8 local_100;
  AbstractTxInReference local_f8;
  Script local_68;
  
  uVar3 = cfd::core::Transaction::GetTxInIndex((Txid *)&this->transaction_,(uint)txid);
  cfd::core::Transaction::GetTxIn((uint)&local_f8);
  cfd::core::Script::Script(&local_68,&local_f8.unlocking_script_);
  core::AbstractTxInReference::~AbstractTxInReference(&local_f8);
  cVar2 = cfd::core::Script::IsEmpty();
  uVar4 = (uint)&this->transaction_;
  if (cVar2 == '\0') {
    local_118.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__ScriptBuilder_002b2fc0;
    local_118.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_100 = 0;
    cfd::core::Script::GetElementList();
    if (local_f8._vptr_AbstractTxInReference != local_f8.txid_._vptr_Txid) {
      pp_Var5 = local_f8._vptr_AbstractTxInReference;
      do {
        cfd::core::ScriptBuilder::AppendElement((ScriptElement *)&local_118);
        pp_Var5 = pp_Var5 + 0xc;
      } while (pp_Var5 != local_f8.txid_._vptr_Txid);
    }
    std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
               &local_f8);
    pBVar6 = (unlocking_scripts->
             super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pBVar1 = (unlocking_scripts->
             super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pBVar6 != pBVar1) {
      do {
        cfd::core::ScriptBuilder::AppendData(&local_118);
        pBVar6 = pBVar6 + 1;
      } while (pBVar6 != pBVar1);
    }
    cfd::core::ScriptBuilder::Build();
    cfd::core::Transaction::SetUnlockingScript(uVar4,(Script *)(ulong)uVar3);
    core::Script::~Script((Script *)&local_f8);
    local_118.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&PTR__ScriptBuilder_002b2fc0;
    if (local_118.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish != (pointer)0x0) {
      operator_delete(local_118.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish);
    }
  }
  else {
    cfd::core::Transaction::SetUnlockingScript(uVar4,(vector *)(ulong)uVar3);
  }
  core::Script::~Script(&local_68);
  return;
}

Assistant:

void TransactionController::InsertUnlockingScript(
    const Txid& txid, uint32_t vout,
    const std::vector<ByteData>& unlocking_scripts) {
  uint32_t txin_index = transaction_.GetTxInIndex(txid, vout);
  Script script = transaction_.GetTxIn(txin_index).GetUnlockingScript();
  if (script.IsEmpty()) {
    transaction_.SetUnlockingScript(txin_index, unlocking_scripts);
  } else {
    ScriptBuilder builder;
    for (const auto& element : script.GetElementList()) {
      builder.AppendElement(element);
    }
    for (const ByteData& data : unlocking_scripts) {
      builder.AppendData(data);
    }
    transaction_.SetUnlockingScript(txin_index, builder.Build());
  }
}